

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_resolv_check(connectdata *conn,Curl_dns_entry **dns)

{
  int iVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  CURLcode CVar8;
  timediff_t tVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  curltime cVar13;
  curltime newer;
  curltime older;
  
  if (((conn->bits).field_0x7 & 0x40) != 0) {
    CVar8 = Curl_doh_is_resolved(conn,dns);
    return CVar8;
  }
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *dns = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  iVar1 = *(int *)((long)pvVar3 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  if (iVar1 != 0) {
    pvVar3 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar3 + 0x48),*(Curl_addrinfo **)((long)pvVar3 + 0x50));
    *(undefined8 *)((long)pvVar3 + 0x50) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *dns = (conn->async).dns;
      return CURLE_OK;
    }
    uVar4 = *(ulong *)&(conn->bits).field_0x4;
    pcVar11 = "proxy";
    if ((uVar4 & 1) == 0) {
      pcVar11 = "host";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar11,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return CURLE_COULDNT_RESOLVE_HOST - ((uint)uVar4 & 1);
  }
  cVar13 = Curl_now();
  uVar5 = (pCVar2->progress).t_startsingle.tv_sec;
  uVar6 = (pCVar2->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar6;
  older.tv_sec = uVar5;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar13._0_12_,0);
  newer.tv_usec = SUB124(cVar13._0_12_,8);
  older._12_4_ = 0;
  tVar9 = Curl_timediff(newer,older);
  lVar10 = 0;
  if (0 < tVar9) {
    lVar10 = tVar9;
  }
  if (*(int *)((long)pvVar3 + 8) == 0) {
    uVar7 = 1;
  }
  else {
    uVar12 = *(int *)((long)pvVar3 + 8) << (*(long *)((long)pvVar3 + 0x10) <= lVar10);
    uVar7 = 0xfa;
    if (uVar12 < 0xfa) {
      uVar7 = uVar12;
    }
    if ((lVar10 < *(long *)((long)pvVar3 + 0x10)) && (uVar12 < 0xfb)) goto LAB_0010c905;
  }
  *(uint *)((long)pvVar3 + 8) = uVar7;
LAB_0010c905:
  *(ulong *)((long)pvVar3 + 0x10) = lVar10 + (ulong)uVar7;
  Curl_expire(conn->data,(ulong)uVar7,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolv_check(struct connectdata *conn,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)dns;
#endif

  if(conn->bits.doh)
    return Curl_doh_is_resolved(conn, dns);
  return Curl_resolver_is_resolved(conn, dns);
}